

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall
kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper(BufferedInputStreamWrapper *this)

{
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__BufferedInputStreamWrapper_0059d168;
  Array<unsigned_char>::~Array(&this->ownedBuffer);
  return;
}

Assistant:

BufferedInputStreamWrapper::~BufferedInputStreamWrapper() noexcept(false) {}